

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

void VP8InitBitReader(VP8BitReader *br,uint8_t *start,size_t size)

{
  ulong *puVar1;
  ulong uVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  
  br->range = 0xfe;
  br->bits = -8;
  br->value = 0;
  br->eof = 0;
  if (start != (uint8_t *)0x0) {
    br->buf = start;
    br->buf_end = start + size;
    puVar4 = start + (size - 7);
    if (size < 8) {
      puVar4 = start;
    }
    br->buf_max = puVar4;
  }
  puVar1 = (ulong *)br->buf;
  if (puVar1 < br->buf_max) {
    uVar2 = *puVar1;
    br->buf = (uint8_t *)((long)puVar1 + 7);
    br->value = ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                 (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                 (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
    br->bits = 0x30;
    return;
  }
  pbVar3 = br->buf;
  if (pbVar3 < br->buf_end) {
    br->bits = br->bits + 8;
    br->buf = pbVar3 + 1;
    br->value = br->value << 8 | (ulong)*pbVar3;
    return;
  }
  if (br->eof != 0) {
    br->bits = 0;
    return;
  }
  br->value = br->value << 8;
  br->bits = br->bits + 8;
  br->eof = 1;
  return;
}

Assistant:

void VP8InitBitReader(VP8BitReader* const br,
                      const uint8_t* const start, size_t size) {
  assert(br != NULL);
  assert(start != NULL);
  assert(size < (1u << 31));   // limit ensured by format and upstream checks
  br->range   = 255 - 1;
  br->value   = 0;
  br->bits    = -8;   // to load the very first 8bits
  br->eof     = 0;
  VP8BitReaderSetBuffer(br, start, size);
  VP8LoadNewBytes(br);
}